

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::FormatForComparisonFailureMessage<iutest::TestFlag::Fragment<8192>,bool>
          (string *__return_storage_ptr__,internal *this,Fragment<8192> *value,bool *param_2)

{
  bool *param_1_local;
  Fragment<8192> *value_local;
  
  PrintToString<iutest::TestFlag::Fragment<8192>>(__return_storage_ptr__,(iutest *)this,value);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}